

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_manager.cpp
# Opt level: O2

MasterLinkPtr __thiscall miniros::ServiceManager::getMasterLink(ServiceManager *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  MasterLinkPtr MVar1;
  
  std::__shared_ptr<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0xe0));
  MVar1.super___shared_ptr<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar1.super___shared_ptr<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (MasterLinkPtr)MVar1.super___shared_ptr<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

MasterLinkPtr ServiceManager::getMasterLink() const
{
  return master_link_;
}